

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O2

void __thiscall
TEST_TestHarness_c_doesCrashIfSetToCrash_Test::~TEST_TestHarness_c_doesCrashIfSetToCrash_Test
          (TEST_TestHarness_c_doesCrashIfSetToCrash_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, doesCrashIfSetToCrash)
{
    cpputestHasCrashed = false;
    UtestShell::setCrashOnFail();
    UtestShell::setCrashMethod(crashMethod);
    fixture->setTestFunction(failMethod_);

    fixture->runAllTests();

    CHECK(cpputestHasCrashed);
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);

    UtestShell::restoreDefaultTestTerminator();
    UtestShell::resetCrashMethod();
}